

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_af1b6::CpuAbsoluteTest_eor_abs_set_neg_clears_zero_Test::
~CpuAbsoluteTest_eor_abs_set_neg_clears_zero_Test
          (CpuAbsoluteTest_eor_abs_set_neg_clears_zero_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest((CpuTest *)this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuAbsoluteTest, eor_abs_set_neg_clears_zero) {
    registers.a = 0b00000000;
    registers.p = Z_FLAG;
    expected.a = 0b10101010;
    expected.p = N_FLAG;
    memory_content = 0b10101010;

    run_read_instruction(EOR_ABS);
}